

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_RegVm.cpp
# Opt level: O0

void __thiscall ExecutorRegVm::InitExecution(ExecutorRegVm *this)

{
  Linker *pLVar1;
  bool bVar2;
  uint *puVar3;
  RegVmRegister *pRVar4;
  uint local_1c;
  RegVmCmd local_18;
  ExecutorRegVm *local_10;
  ExecutorRegVm *this_local;
  
  local_10 = this;
  FastVector<RegVmCmd_*,_false,_false>::clear(&this->callStack);
  this->lastFinalReturn = 0;
  CommonSetLinker(this->exLinker);
  FastVector<char,_true,_true>::reserve(&this->dataStack,this->minStackSize);
  FastVector<char,_true,_true>::clear(&this->dataStack);
  FastVector<char,_true,_true>::resize
            (&this->dataStack,this->exLinker->globalVarSize + 0xf & 0xfffffff0);
  GC::SetUnmanagableRange((this->dataStack).data,(this->dataStack).max);
  this->execErrorMessage = (char *)0x0;
  (this->execErrorObject).typeID = 0;
  (this->execErrorObject).ptr = (char *)0x0;
  this->execErrorFinalReturnDepth = 0;
  this->callContinue = true;
  pLVar1 = this->exLinker;
  RegVmCmd::RegVmCmd(&local_18,rviReturn,'\0','\x05','\0',0);
  FastVector<RegVmCmd,_false,_false>::push_back(&pLVar1->exRegVmCode,&local_18);
  local_1c = 0;
  FastVector<unsigned_int,_false,_false>::push_back(&this->exLinker->exRegVmExecCount,&local_1c);
  if (this->tempStackArrayBase == (uint *)0x0) {
    puVar3 = (uint *)(*(code *)NULLC::alloc)(0x10000);
    this->tempStackArrayBase = puVar3;
    memset(this->tempStackArrayBase,0,0x10000);
    this->tempStackArrayEnd = this->tempStackArrayBase + 0x4000;
  }
  if (this->regFileArrayBase == (RegVmRegister *)0x0) {
    pRVar4 = (RegVmRegister *)(*(code *)NULLC::alloc)(0x40000);
    this->regFileArrayBase = pRVar4;
    memset(this->regFileArrayBase,0,0x40000);
    this->regFileArrayEnd = this->regFileArrayBase + 0x8000;
  }
  this->regFileLastTop = this->regFileArrayBase;
  bVar2 = FastVector<unsigned_char,_false,_false>::empty(&this->exLinker->fullLinkerData);
  if (!bVar2) {
    nullcVmContextMainDataAddress = (uintptr_t)&this->dataStack;
  }
  return;
}

Assistant:

void ExecutorRegVm::InitExecution()
{
	callStack.clear();

	lastFinalReturn = 0;

	CommonSetLinker(exLinker);

	dataStack.reserve(minStackSize);
	dataStack.clear();
	dataStack.resize((exLinker->globalVarSize + 0xf) & ~0xf);

	GC::SetUnmanagableRange(dataStack.data, dataStack.max);

	execErrorMessage = NULL;

	execErrorObject.typeID = 0;
	execErrorObject.ptr = NULL;

	execErrorFinalReturnDepth = 0;

	callContinue = true;

	// Add return after the last instruction to end execution of code with no return at the end
	exLinker->exRegVmCode.push_back(RegVmCmd(rviReturn, 0, rvrError, 0, 0));
	exLinker->exRegVmExecCount.push_back(0);

	if(!tempStackArrayBase)
	{
		tempStackArrayBase = (unsigned*)NULLC::alloc(sizeof(unsigned) * 1024 * 16);
		memset(tempStackArrayBase, 0, sizeof(unsigned) * 1024 * 16);
		tempStackArrayEnd = tempStackArrayBase + 1024 * 16;
	}

	if(!regFileArrayBase)
	{
		regFileArrayBase = (RegVmRegister*)NULLC::alloc(sizeof(RegVmRegister) * 1024 * 32);
		memset(regFileArrayBase, 0, sizeof(RegVmRegister) * 1024 * 32);
		regFileArrayEnd = regFileArrayBase + 1024 * 32;
	}

	regFileLastTop = regFileArrayBase;

#if !defined(NULLC_NO_RAW_EXTERNAL_CALL)
	if(!dcCallVM)
	{
		dcCallVM = dcNewCallVM(4096);
		dcMode(dcCallVM, DC_CALL_C_DEFAULT);
	}
#endif

	if(!exLinker->fullLinkerData.empty())
	{
		nullcVmContextMainDataAddress = uintptr_t(&dataStack);
	}
}